

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

ssize_t ws_client_collect(uchar *buf,size_t buflen,int frame_age,int frame_flags,
                         curl_off_t payload_offset,curl_off_t payload_len,void *userp,CURLcode *err)

{
  CURLcode CVar1;
  size_t local_70;
  size_t local_68;
  size_t bytes;
  curl_off_t remain;
  size_t nwritten;
  long lStack_48;
  _Bool auto_pong;
  Curl_easy *data;
  ws_collect *ctx;
  curl_off_t payload_len_local;
  curl_off_t payload_offset_local;
  int frame_flags_local;
  int frame_age_local;
  size_t buflen_local;
  uchar *buf_local;
  
  data = (Curl_easy *)userp;
  lStack_48 = *userp;
  nwritten._7_1_ = ((*(ulong *)(lStack_48 + 0xa2c) >> 0x38 & 1) != 0 ^ 0xffU) & 1;
  bytes = payload_len - (payload_offset + buflen);
  if (*(long *)((long)userp + 0x18) == 0) {
    *(int *)((long)userp + 0x20) = frame_age;
    *(int *)((long)userp + 0x24) = frame_flags;
    *(curl_off_t *)((long)userp + 0x28) = payload_offset;
    *(curl_off_t *)((long)userp + 0x30) = payload_len;
  }
  ctx = (ws_collect *)payload_len;
  payload_len_local = payload_offset;
  payload_offset_local._0_4_ = frame_flags;
  payload_offset_local._4_4_ = frame_age;
  _frame_flags_local = buflen;
  buflen_local = (size_t)buf;
  if (((nwritten._7_1_ == 0) || ((frame_flags & 0x10U) == 0)) || (bytes != 0)) {
    *(undefined1 *)((long)userp + 0x38) = 1;
    local_70 = buflen;
    if ((ulong)(*(long *)((long)userp + 0x10) - *(long *)((long)userp + 0x18)) <= buflen) {
      local_70 = *(long *)((long)userp + 0x10) - *(long *)((long)userp + 0x18);
    }
    remain = local_70;
    if (local_70 == 0) {
      if (buflen == 0) {
        *err = CURLE_OK;
        return 0;
      }
      *err = CURLE_AGAIN;
      return -1;
    }
    *err = CURLE_OK;
    memcpy((void *)(*(long *)((long)userp + 8) + *(long *)((long)userp + 0x18)),buf,local_70);
    data->sub_xfer_done = data->sub_xfer_done + remain;
  }
  else {
    if (((*userp != 0) && ((*(ulong *)(*userp + 0xa2c) >> 0x1e & 1) != 0)) &&
       ((*(long *)(*userp + 0x1310) == 0 || (0 < *(int *)(*(long *)(*userp + 0x1310) + 8))))) {
      Curl_infof(*userp,"WS: auto-respond to PING with a PONG");
    }
    CVar1 = curl_ws_send(*(CURL **)data,(void *)buflen_local,_frame_flags_local,&local_68,0,0x40);
    *err = CVar1;
    if (*err != CURLE_OK) {
      return -1;
    }
    remain = local_68;
  }
  return remain;
}

Assistant:

static ssize_t ws_client_collect(const unsigned char *buf, size_t buflen,
                                 int frame_age, int frame_flags,
                                 curl_off_t payload_offset,
                                 curl_off_t payload_len,
                                 void *userp,
                                 CURLcode *err)
{
  struct ws_collect *ctx = userp;
  struct Curl_easy *data = ctx->data;
  bool auto_pong = !data->set.ws_no_auto_pong;
  size_t nwritten;
  curl_off_t remain = (payload_len - (payload_offset + buflen));

  if(!ctx->bufidx) {
    /* first write */
    ctx->frame_age = frame_age;
    ctx->frame_flags = frame_flags;
    ctx->payload_offset = payload_offset;
    ctx->payload_len = payload_len;
  }

  if(auto_pong && (frame_flags & CURLWS_PING) && !remain) {
    /* auto-respond to PINGs, only works for single-frame payloads atm */
    size_t bytes;
    infof(ctx->data, "WS: auto-respond to PING with a PONG");
    /* send back the exact same content as a PONG */
    *err = curl_ws_send(ctx->data, buf, buflen, &bytes, 0, CURLWS_PONG);
    if(*err)
      return -1;
    nwritten = bytes;
  }
  else {
    ctx->written = TRUE;
    DEBUGASSERT(ctx->buflen >= ctx->bufidx);
    nwritten = CURLMIN(buflen, ctx->buflen - ctx->bufidx);
    if(!nwritten) {
      if(!buflen) {  /* 0 length write, we accept that */
        *err = CURLE_OK;
        return 0;
      }
      *err = CURLE_AGAIN;  /* no more space */
      return -1;
    }
    *err = CURLE_OK;
    memcpy(ctx->buffer + ctx->bufidx, buf, nwritten);
    ctx->bufidx += nwritten;
  }
  return nwritten;
}